

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_header_table.cpp
# Opt level: O0

bool __thiscall BmsHeaderTable::Query(BmsHeaderTable *this,string *key,double *v)

{
  bool bVar1;
  BmsHeader *this_00;
  double dVar2;
  double *v_local;
  string *key_local;
  BmsHeaderTable *this_local;
  
  bVar1 = IsExists(this,key);
  if (bVar1) {
    this_00 = operator[](this,key);
    dVar2 = BmsHeader::ToFloat(this_00);
    *v = dVar2;
  }
  return bVar1;
}

Assistant:

bool
BmsHeaderTable::Query(const std::string& key, double* v)
{
	if (IsExists(key)) {
		*v = this->operator[](key).ToFloat();
		return true;
	}
	return false;
}